

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprListCompare(ExprList *pA,ExprList *pB,int iTab)

{
  int iVar1;
  Expr *pExprB;
  Expr *pExprA;
  int i;
  int iTab_local;
  ExprList *pB_local;
  ExprList *pA_local;
  
  if ((pA == (ExprList *)0x0) && (pB == (ExprList *)0x0)) {
    pA_local._4_4_ = 0;
  }
  else if ((pA == (ExprList *)0x0) || (pB == (ExprList *)0x0)) {
    pA_local._4_4_ = 1;
  }
  else if (pA->nExpr == pB->nExpr) {
    for (pExprA._0_4_ = 0; (int)pExprA < pA->nExpr; pExprA._0_4_ = (int)pExprA + 1) {
      if (pA->a[(int)pExprA].sortOrder != pB->a[(int)pExprA].sortOrder) {
        return 1;
      }
      iVar1 = sqlite3ExprCompare((Parse *)0x0,pA->a[(int)pExprA].pExpr,pB->a[(int)pExprA].pExpr,iTab
                                );
      if (iVar1 != 0) {
        return 1;
      }
    }
    pA_local._4_4_ = 0;
  }
  else {
    pA_local._4_4_ = 1;
  }
  return pA_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprListCompare(ExprList *pA, ExprList *pB, int iTab){
  int i;
  if( pA==0 && pB==0 ) return 0;
  if( pA==0 || pB==0 ) return 1;
  if( pA->nExpr!=pB->nExpr ) return 1;
  for(i=0; i<pA->nExpr; i++){
    Expr *pExprA = pA->a[i].pExpr;
    Expr *pExprB = pB->a[i].pExpr;
    if( pA->a[i].sortOrder!=pB->a[i].sortOrder ) return 1;
    if( sqlite3ExprCompare(0, pExprA, pExprB, iTab) ) return 1;
  }
  return 0;
}